

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O3

int Gia_ManArePrintListUsed(Gia_ManAre_t *p,Gia_PtrAre_t Root)

{
  uint **ppuVar1;
  int iVar2;
  Gia_StaAre_t *pGVar3;
  Gia_StaAre_t *pSta;
  
  ppuVar1 = p->ppStas;
  iVar2 = p->nSize;
  pSta = (Gia_StaAre_t *)
         ((long)(int)(((uint)Root & 0xfffff) * iVar2) * 4 +
         *(long *)((long)ppuVar1 + (ulong)((uint)Root >> 0x11 & 0x3ff8)));
  pGVar3 = (Gia_StaAre_t *)*ppuVar1;
  if (pGVar3 != pSta) {
    do {
      if (-1 < (int)pSta->iPrev) {
        Gia_ManArePrintCube(p,pSta);
        ppuVar1 = p->ppStas;
        iVar2 = p->nSize;
        pGVar3 = (Gia_StaAre_t *)*ppuVar1;
      }
      pSta = (Gia_StaAre_t *)
             ((long)(int)(((uint)pSta->iNext & 0xfffff) * iVar2) * 4 +
             *(long *)((long)ppuVar1 + (ulong)((uint)pSta->iNext >> 0x11 & 0x3ff8)));
    } while (pGVar3 != pSta);
  }
  return (int)ppuVar1;
}

Assistant:

static inline int Gia_ManArePrintListUsed( Gia_ManAre_t * p, Gia_PtrAre_t Root )
{
    Gia_StaAre_t * pCube;
    Gia_ManAreForEachCubeList( p, Gia_ManAreSta(p, Root), pCube )
        if ( Gia_StaIsUsed(pCube) )
            Gia_ManArePrintCube( p, pCube );
    return 1;
}